

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O0

void strbuffer_init(strbuffer_t *buffer,int capacity,int increment)

{
  char *pcVar1;
  int increment_local;
  int capacity_local;
  strbuffer_t *buffer_local;
  
  if (capacity < 0x50) {
    buffer->capacity = 0x50;
  }
  else {
    buffer->capacity = capacity;
  }
  if (increment < 10) {
    buffer->increment = 10;
  }
  else {
    buffer->increment = increment;
  }
  pcVar1 = (char *)malloc((long)buffer->capacity);
  buffer->data = pcVar1;
  buffer->pos = 0;
  return;
}

Assistant:

void strbuffer_init(strbuffer_t* buffer, int capacity, int increment)
{
    if (capacity < MIN_CAPACITY)
        buffer->capacity = MIN_CAPACITY;
    else buffer->capacity = capacity;

    if (increment < MIN_INCREMENT)
        buffer->increment = MIN_INCREMENT;
    else buffer->increment = increment;

    buffer->data = (char*) malloc(buffer->capacity * sizeof(char));
    buffer->pos = 0;
}